

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArenaAllocator.cpp
# Opt level: O0

StandAloneFreeListPolicy * Memory::StandAloneFreeListPolicy::NewInternal(uint entries)

{
  HeapAllocator *alloc;
  StandAloneFreeListPolicy *__s;
  TrackAllocData local_48;
  StandAloneFreeListPolicy *_this;
  size_t plusSize;
  uint entries_local;
  
  _this = (StandAloneFreeListPolicy *)((ulong)entries * 0x10 + 0x100);
  plusSize._4_4_ = entries;
  TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,(size_t)_this,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/ArenaAllocator.cpp"
             ,0x3c5);
  alloc = HeapAllocator::TrackAllocInfo(&HeapAllocator::Instance,&local_48);
  __s = (StandAloneFreeListPolicy *)new<Memory::HeapAllocator>(0x20,alloc,true,0x8e2230,0);
  memset(__s,0,0x20);
  if (__s != (StandAloneFreeListPolicy *)0x0) {
    __s->allocated = plusSize._4_4_;
    __s->freeObjectLists = &__s[1].allocated;
    __s->entries = (FreeObjectListEntry *)(__s->freeObjectLists + 0x40);
  }
  return __s;
}

Assistant:

StandAloneFreeListPolicy * StandAloneFreeListPolicy::NewInternal(uint entries)
{
    size_t plusSize = buckets * sizeof(uint) + entries * sizeof(FreeObjectListEntry);
    StandAloneFreeListPolicy * _this = HeapNewNoThrowPlusZ(plusSize, StandAloneFreeListPolicy);

    if (NULL != _this)
    {
        _this->allocated = entries;
        _this->freeObjectLists = (uint *)(_this + 1);
        _this->entries = (FreeObjectListEntry *)(_this->freeObjectLists + buckets);
    }

    return _this;
}